

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedStringFieldGenerator::GenerateSerializedSizeCode
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldOptions *pFVar2;
  Printer *printer_local;
  RepeatedStringFieldGenerator *this_local;
  
  google::protobuf::io::Printer::Print((map *)printer,(char *)&this->variables_);
  google::protobuf::io::Printer::Indent();
  google::protobuf::io::Printer::Print((map *)printer,(char *)&this->variables_);
  google::protobuf::io::Printer::Print((char *)printer);
  pFVar2 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(pFVar2);
  if (bVar1) {
    google::protobuf::io::Printer::Print((map *)printer,(char *)&this->variables_);
  }
  else {
    google::protobuf::io::Printer::Print((map *)printer,(char *)&this->variables_);
  }
  pFVar2 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(pFVar2);
  if (bVar1) {
    google::protobuf::io::Printer::Print((map *)printer,(char *)&this->variables_);
  }
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Print((char *)printer);
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(variables_,
    "{\n"
    "  int dataSize = 0;\n");
  printer->Indent();

  printer->Print(variables_,
    "for (int i = 0; i < $name$_.size(); i++) {\n"
    "  dataSize += com.google.protobuf.CodedOutputStream\n"
    "    .computeBytesSizeNoTag($name$_.getByteString(i));\n"
    "}\n");

  printer->Print(
      "size += dataSize;\n");

  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "if (!get$capitalized_name$List().isEmpty()) {\n"
      "  size += $tag_size$;\n"
      "  size += com.google.protobuf.CodedOutputStream\n"
      "      .computeInt32SizeNoTag(dataSize);\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "size += $tag_size$ * get$capitalized_name$List().size();\n");
  }

  // cache the data size for packed fields.
  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "$name$MemoizedSerializedSize = dataSize;\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}